

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_exec(opj_jp2_t *jp2,opj_procedure_list_t *p_procedure_list,
                     opj_stream_private_t *stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  opj_procedure *pp_Var3;
  uint uVar4;
  long lVar5;
  
  if (p_procedure_list != (opj_procedure_list_t *)0x0) {
    OVar1 = opj_procedure_list_get_nb_procedures(p_procedure_list);
    pp_Var3 = opj_procedure_list_get_first_procedure(p_procedure_list);
    uVar4 = 1;
    for (lVar5 = 0; OVar1 != (OPJ_UINT32)lVar5; lVar5 = lVar5 + 1) {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        iVar2 = (*pp_Var3[lVar5])(jp2,stream,p_manager);
        uVar4 = (uint)(iVar2 != 0);
      }
    }
    opj_procedure_list_clear(p_procedure_list);
    return uVar4;
  }
  __assert_fail("p_procedure_list != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x8cb,
                "OPJ_BOOL opj_jp2_exec(opj_jp2_t *, opj_procedure_list_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_exec (  opj_jp2_t * jp2,
                                opj_procedure_list_t * p_procedure_list,
                                opj_stream_private_t *stream,
                                opj_event_mgr_t * p_manager
                                )

{
	OPJ_BOOL (** l_procedure) (opj_jp2_t * jp2, opj_stream_private_t *, opj_event_mgr_t *) = 00;
	OPJ_BOOL l_result = OPJ_TRUE;
	OPJ_UINT32 l_nb_proc, i;

	/* preconditions */
	assert(p_procedure_list != 00);
	assert(jp2 != 00);
	assert(stream != 00);
	assert(p_manager != 00);

	l_nb_proc = opj_procedure_list_get_nb_procedures(p_procedure_list);
	l_procedure = (OPJ_BOOL (**) (opj_jp2_t * jp2, opj_stream_private_t *, opj_event_mgr_t *)) opj_procedure_list_get_first_procedure(p_procedure_list);

	for	(i=0;i<l_nb_proc;++i) {
		l_result = l_result && (*l_procedure) (jp2,stream,p_manager);
		++l_procedure;
	}

	/* and clear the procedure list at the end. */
	opj_procedure_list_clear(p_procedure_list);
	return l_result;
}